

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harmonic.cpp
# Opt level: O3

void __thiscall Harmonic::star_map(Harmonic *this)

{
  Vertex *pVVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  CVertexTrait *pCVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  SolidVertexIterator viter;
  double local_150;
  undefined1 local_148 [24];
  TreeIterator<MeshLib::Vertex> local_130;
  
  AVL::TreeIterator<MeshLib::Vertex>::TreeIterator(&local_130,&this->_nmesh->m_verts);
  if (local_130.m_finished == false) {
    local_148._0_16_ = ZEXT816(0);
    local_150 = 0.0;
    do {
      pVVar1 = (local_130.m_pointer)->data;
      local_148._8_8_ = (double)local_148._8_8_ + (pVVar1->m_point).v[1];
      local_148._0_8_ = (double)local_148._0_8_ + (pVVar1->m_point).v[0];
      local_150 = local_150 + (pVVar1->m_point).v[2];
      AVL::TreeIterator<MeshLib::Vertex>::operator++(&local_130);
    } while (local_130.m_finished == false);
  }
  else {
    local_148._0_16_ = ZEXT816(0);
    local_150 = 0.0;
  }
  iVar4 = MeshLib::Solid::numVertices(this->_nmesh);
  AVL::TreeIterator<MeshLib::Vertex>::TreeIterator(&local_130,&this->_nmesh->m_verts);
  if (local_130.m_finished == false) {
    dVar2 = (double)iVar4;
    auVar6._8_4_ = SUB84(dVar2,0);
    auVar6._0_8_ = dVar2;
    auVar6._12_4_ = (int)((ulong)dVar2 >> 0x20);
    auVar6 = divpd(local_148._0_16_,auVar6);
    do {
      pVVar1 = (local_130.m_pointer)->data;
      dVar3 = (pVVar1->m_point).v[2] - local_150 / dVar2;
      local_148._0_8_ = auVar6._0_8_;
      local_148._8_8_ = auVar6._8_8_;
      auVar7._0_8_ = (pVVar1->m_point).v[0] - (double)local_148._0_8_;
      auVar7._8_8_ = (pVVar1->m_point).v[1] - (double)local_148._8_8_;
      dVar9 = SQRT(ABS(dVar3 * dVar3 + auVar7._0_8_ * auVar7._0_8_ + auVar7._8_8_ * auVar7._8_8_));
      auVar8._8_8_ = dVar9;
      auVar8._0_8_ = dVar9;
      auVar8 = divpd(auVar7,auVar8);
      *(undefined1 (*) [16])(pVVar1->m_point).v = auVar8;
      (pVVar1->m_point).v[2] = dVar3 / dVar9;
      pCVar5 = MeshLib::trait<MeshLib::CVertexTrait,MeshLib::Vertex>(pVVar1);
      dVar3 = (pVVar1->m_point).v[1];
      (pCVar5->c_normal).v[0] = (pVVar1->m_point).v[0];
      (pCVar5->c_normal).v[1] = dVar3;
      (pCVar5->c_normal).v[2] = (pVVar1->m_point).v[2];
      AVL::TreeIterator<MeshLib::Vertex>::operator++(&local_130);
    } while (local_130.m_finished == false);
  }
  return;
}

Assistant:

void Harmonic::star_map() {
	Point center(0, 0, 0);
	for (SolidVertexIterator viter(_nmesh); !viter.end(); ++viter) {
		Solid::tVertex vertex = *viter;
		center += vertex->point();
	}
	center /= _nmesh->numVertices();
	for (SolidVertexIterator viter(_nmesh); !viter.end(); ++viter) {
		Solid::tVertex vertex = *viter;
		vertex->point() -= center;
		vertex->point() /= vertex->point().norm();
		v_n(vertex) = vertex->point();
	}
}